

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockRangeFactory.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::BlockRangeFactory::buildRanges(BlockRangeFactory *this,RangeTokenMap *rangeTokMap)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  TokenFactory *this_00;
  RangeToken *pRVar4;
  RangeToken *tok;
  int i;
  bool foundPrivate;
  bool foundSpecial;
  TokenFactory *tokFactory;
  RangeTokenMap *rangeTokMap_local;
  BlockRangeFactory *this_local;
  
  if (((this->super_RangeFactory).fRangesCreated & 1U) == 0) {
    if (((this->super_RangeFactory).fKeywordsInitialized & 1U) == 0) {
      (*(this->super_RangeFactory)._vptr_RangeFactory[2])();
    }
    this_00 = RangeTokenMap::getTokenFactory(rangeTokMap);
    bVar1 = false;
    bVar2 = false;
    for (tok._0_4_ = 0; (int)tok < 0x5d; tok._0_4_ = (int)tok + 1) {
      pRVar4 = TokenFactory::createRange(this_00,false);
      (*(pRVar4->super_Token)._vptr_Token[0xc])
                (pRVar4,(ulong)*(uint *)(blockRanges + (long)((int)tok << 1) * 4),
                 (ulong)*(uint *)(blockRanges + (long)((int)tok * 2 + 1) * 4));
      if ((!bVar1) &&
         (bVar3 = XMLString::equals((XMLCh *)(fgBlockNames + (long)(int)tok * 100),
                                    (XMLCh *)fgBlockIsSpecials), bVar3)) {
        (*(pRVar4->super_Token)._vptr_Token[0xc])(pRVar4,0xfff0,0xfffd);
        bVar1 = true;
      }
      if ((!bVar2) &&
         (bVar3 = XMLString::equals((XMLCh *)(fgBlockNames + (long)(int)tok * 100),
                                    (XMLCh *)fgBlockIsPrivateUse), bVar3)) {
        (*(pRVar4->super_Token)._vptr_Token[0xc])(pRVar4,0xf0000,0xffffd);
        (*(pRVar4->super_Token)._vptr_Token[0xc])(pRVar4,0x100000,0x10fffd);
        bVar2 = true;
      }
      RangeToken::createMap(pRVar4);
      RangeTokenMap::setRangeToken
                (rangeTokMap,(XMLCh *)(fgBlockNames + (long)(int)tok * 100),pRVar4,false);
      pRVar4 = RangeToken::complementRanges(pRVar4,this_00,XMLPlatformUtils::fgMemoryManager);
      RangeToken::createMap(pRVar4);
      RangeTokenMap::setRangeToken
                (rangeTokMap,(XMLCh *)(fgBlockNames + (long)(int)tok * 100),pRVar4,true);
    }
    (this->super_RangeFactory).fRangesCreated = true;
  }
  return;
}

Assistant:

void BlockRangeFactory::buildRanges(RangeTokenMap *rangeTokMap) {

    if (fRangesCreated)
        return;

    if (!fKeywordsInitialized) {
        initializeKeywordMap(rangeTokMap);
    }

    TokenFactory* tokFactory = rangeTokMap->getTokenFactory();

    //for performance, once the desired specials and private use are found
    //don't need to compareString anymore
    bool foundSpecial = false;
    bool foundPrivate = false;

    for (int i=0; i < BLOCKNAMESIZE; i++) {
        RangeToken* tok = tokFactory->createRange();
        tok->addRange(blockRanges[i*2], blockRanges[(i*2)+1]);

        if (!foundSpecial && XMLString::equals((XMLCh*)fgBlockNames[i] , (XMLCh*) fgBlockIsSpecials)) {
            tok->addRange(0xFFF0, 0xFFFD);
            foundSpecial = true;
        }
        if (!foundPrivate && XMLString::equals((XMLCh*)fgBlockNames[i] , (XMLCh*) fgBlockIsPrivateUse)) {
            tok->addRange(0xF0000, 0xFFFFD);
            tok->addRange(0x100000, 0x10FFFD);
            foundPrivate = true;
        }

        // Build the internal map.
        tok->createMap();
        rangeTokMap->setRangeToken(fgBlockNames[i], tok);
        tok = RangeToken::complementRanges(tok, tokFactory);
        // Build the internal map.
        tok->createMap();
        rangeTokMap->setRangeToken(fgBlockNames[i], tok , true);
    }

    fRangesCreated = true;
}